

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_prim.c
# Opt level: O3

void LowPrimitives(int mode)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  long lVar6;
  byte bVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  
  if (mode == 2) {
    al_set_blender(0,1,Blend != 0);
    al_use_transform(&MainTrans);
    al_draw_prim(LowPrimitives::vtx,0,0,0,4,0);
    al_draw_prim(LowPrimitives::vtx,0,0,4,9,1);
    al_draw_prim(LowPrimitives::vtx,0,0,9,0xd,2);
    al_draw_prim(LowPrimitives::vtx2,0,0,0,0xd,6);
    al_use_transform(&Identity);
    return;
  }
  if (mode != 1) {
    if (mode == 0) {
      cVar2 = -0x80;
      bVar5 = 2;
      lVar8 = 0x1c;
      cVar3 = '@';
      bVar7 = 1;
      cVar4 = '\0';
      lVar6 = 0;
      do {
        uVar1 = (uint)lVar6;
        fVar9 = (float)(int)uVar1 / 13.0;
        fVar9 = (fVar9 + fVar9) * 3.1415927;
        fVar10 = cosf(fVar9);
        fVar9 = sinf(fVar9);
        lVar6 = lVar6 + 1;
        uVar11 = al_map_rgb(((byte)((uint)bVar7 * 0xab >> 8) & 6) * ' ' + cVar3,
                            ((byte)((uint)bVar5 * 0xab >> 8) & 6) * ' ' + cVar2,
                            ((byte)((uVar1 & 0xff) * 0xab >> 8) & 6) * ' ' + cVar4);
        *(ulong *)((long)MainTrans.m[3] + lVar8) = CONCAT44(fVar9 * 200.0,fVar10 * 200.0);
        *(undefined4 *)((long)MainTrans.m[3] + lVar8 + 8) = 0;
        *(ulong *)((long)&LowPrimitives::vtx[0xc].color.r + lVar8) =
             CONCAT44(fVar9 * 200.0 * 0.1,fVar10 * 200.0 * 0.1);
        *(undefined8 *)(lVar8 + 0x1094d8) = uVar11;
        *(undefined4 *)((long)&LowPrimitives::vtx[0].x + lVar8) = in_XMM1_Da;
        *(undefined4 *)((long)&LowPrimitives::vtx[0].y + lVar8) = in_XMM1_Db;
        *(undefined8 *)(lVar8 + 0x1096b8) = uVar11;
        *(undefined4 *)((long)&LowPrimitives::vtx2[0].x + lVar8) = in_XMM1_Da;
        *(undefined4 *)((long)&LowPrimitives::vtx2[0].y + lVar8) = in_XMM1_Db;
        cVar2 = cVar2 + '@';
        bVar5 = bVar5 + 1;
        cVar4 = cVar4 + '@';
        lVar8 = lVar8 + 0x24;
        cVar3 = cVar3 + '@';
        bVar7 = bVar7 + 1;
      } while (lVar6 != 0xd);
    }
    return;
  }
  Theta = Speed + Theta;
  al_build_transform((float)(ScreenW / 2),(float)(ScreenH / 2),0x3f800000,0x3f800000,&MainTrans);
  return;
}

Assistant:

static void LowPrimitives(int mode)
{
   static ALLEGRO_VERTEX vtx[13];
   static ALLEGRO_VERTEX vtx2[13];
   if (mode == INIT) {
      int ii = 0;
      ALLEGRO_COLOR color;
      for (ii = 0; ii < 13; ii++) {
         float x, y;
         x = 200 * cosf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         y = 200 * sinf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         
         color = al_map_rgb((ii + 1) % 3 * 64, (ii + 2) % 3 * 64, (ii) % 3 * 64);
         
         vtx[ii].x = x; vtx[ii].y = y; vtx[ii].z = 0;
         vtx2[ii].x = 0.1 * x; vtx2[ii].y = 0.1 * y;
         vtx[ii].color = color;
         vtx2[ii].color = color;
      }
   } else if (mode == LOGIC) {
      Theta += Speed;
      al_build_transform(&MainTrans, ScreenW / 2, ScreenH / 2, 1, 1, Theta);
   } else if (mode == DRAW) {
      if (Blend)
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ONE);
      else
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      
      al_use_transform(&MainTrans);
      
      al_draw_prim(vtx, 0, 0, 0, 4, ALLEGRO_PRIM_LINE_LIST);
      al_draw_prim(vtx, 0, 0, 4, 9, ALLEGRO_PRIM_LINE_STRIP);
      al_draw_prim(vtx, 0, 0, 9, 13, ALLEGRO_PRIM_LINE_LOOP);
      al_draw_prim(vtx2, 0, 0, 0, 13, ALLEGRO_PRIM_POINT_LIST);
      
      al_use_transform(&Identity);
   }
}